

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

void ShDestruct(ShHandle handle)

{
  long lVar1;
  TCompiler *compiler;
  TShHandleBase *linker;
  TUniformMap *map;
  TShHandleBase *base;
  ShHandle handle_local;
  
  if (handle != (ShHandle)0x0) {
    lVar1 = (**(code **)(*handle + 0x10))();
    if (lVar1 == 0) {
      lVar1 = (**(code **)(*handle + 0x18))();
      if (lVar1 == 0) {
        lVar1 = (**(code **)(*handle + 0x20))();
        if (lVar1 != 0) {
          map = (TUniformMap *)(**(code **)(*handle + 0x20))();
          DeleteUniformMap(map);
        }
      }
      else {
        linker = (TShHandleBase *)(**(code **)(*handle + 0x18))();
        DeleteLinker(linker);
      }
    }
    else {
      compiler = (TCompiler *)(**(code **)(*handle + 0x10))();
      DeleteCompiler(compiler);
    }
  }
  return;
}

Assistant:

void ShDestruct(ShHandle handle)
{
    if (handle == nullptr)
        return;

    TShHandleBase* base = static_cast<TShHandleBase*>(handle);

    if (base->getAsCompiler())
        DeleteCompiler(base->getAsCompiler());
    else if (base->getAsLinker())
        DeleteLinker(base->getAsLinker());
    else if (base->getAsUniformMap())
        DeleteUniformMap(base->getAsUniformMap());
}